

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disp_repository.cpp
# Opt level: O2

void __thiscall so_5::impl::disp_repository_t::start(disp_repository_t *this)

{
  default_rw_spinlock_t *this_00;
  _Base_ptr p_Var1;
  
  this_00 = &this->m_lock;
  rw_spinlock_t<so_5::yield_backoff_t>::lock(this_00);
  if (this->m_state == not_started) {
    for (p_Var1 = (this->m_named_dispatcher_map)._M_t._M_impl.super__Rb_tree_header._M_header.
                  _M_left;
        (_Rb_tree_header *)p_Var1 !=
        &(this->m_named_dispatcher_map)._M_t._M_impl.super__Rb_tree_header;
        p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
      (**(code **)(**(long **)(p_Var1 + 2) + 0x28))(*(long **)(p_Var1 + 2),p_Var1 + 1);
      (**(code **)(**(long **)(p_Var1 + 2) + 0x10))(*(long **)(p_Var1 + 2),this->m_env);
    }
    this->m_state = started;
  }
  LOCK();
  (this_00->m_counters).super___atomic_base<unsigned_long>._M_i =
       (this_00->m_counters).super___atomic_base<unsigned_long>._M_i - 1;
  UNLOCK();
  return;
}

Assistant:

void
disp_repository_t::start()
{
	std::lock_guard< default_rw_spinlock_t > lock( m_lock );
	if( state_t::not_started == m_state )
	{
		auto it = m_named_dispatcher_map.begin();
		auto it_end = m_named_dispatcher_map.end();

		for( ; it != it_end; ++it )
		{
			it->second->set_data_sources_name_base( it->first );
			it->second->start( m_env );
		}

		m_state = state_t::started;
	}
}